

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O3

int rfft2b_(int *ldim,int *l,int *m,double *r__,double *wsave,int *lensav,double *work,int *lenwrk,
           int *ier)

{
  int *jump;
  double *pdVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  double *pdVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  double *pdVar11;
  int iVar12;
  int iVar13;
  double dVar14;
  int ier1;
  ulong local_90;
  int local_84;
  int *local_80;
  int mmsav;
  double *local_70;
  ulong local_68;
  int mwsav;
  int ldw;
  int ldh;
  int local_54;
  double *local_50;
  double *local_48;
  double *local_40;
  int i__3;
  
  local_68 = (ulong)*ldim;
  *ier = 0;
  iVar12 = *l;
  local_80 = ldim;
  local_70 = r__;
  local_50 = wsave;
  dVar14 = log((double)iVar12);
  iVar12 = (int)(dVar14 / 0.6931471805599453) + iVar12;
  iVar2 = *m;
  dVar14 = log((double)iVar2);
  iVar13 = (int)(dVar14 / 0.6931471805599453) + iVar2 * 2 + 4;
  iVar2 = *m;
  mwsav = iVar13;
  dVar14 = log((double)iVar2);
  pdVar1 = local_70;
  mmsav = iVar2 + (int)(dVar14 / 0.6931471805599453) + 4;
  iVar2 = iVar13 + iVar12 + 4;
  iVar13 = 2;
  if (mmsav + iVar2 <= *lensav) {
    uVar4 = *l;
    uVar3 = *m;
    iVar13 = 3;
    if ((int)((uVar4 + 1) * uVar3) <= *lenwrk) {
      local_84 = *local_80;
      iVar13 = 5;
      if ((int)uVar4 <= local_84) {
        local_90 = ~local_68;
        local_40 = local_50 + -1;
        if (2 < (int)uVar3) {
          uVar5 = uVar3 + 1 & 0x7ffffffe;
          uVar7 = 3;
          if (3 < uVar5) {
            uVar7 = (ulong)uVar5;
          }
          pdVar6 = local_70 + local_90 + local_68 * 2 + 1;
          lVar8 = uVar7 - 2;
          do {
            *pdVar6 = *pdVar6 + *pdVar6;
            pdVar6 = pdVar6 + local_68;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
          pdVar6 = local_70 + local_68 * 3 + local_90 + 1;
          uVar7 = 3;
          do {
            *pdVar6 = -*pdVar6;
            uVar7 = uVar7 + 2;
            pdVar6 = pdVar6 + local_68 * 2;
          } while (uVar7 <= uVar3);
        }
        local_84 = local_84 * uVar3;
        local_48 = local_40 + (long)iVar2 + 1;
        rfftmb_(&c__1,&c__1,m,local_80,local_70,&local_84,local_48,&mmsav,work,lenwrk,&ier1);
        iVar2 = *l;
        iVar13 = (iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1;
        ldh = iVar13;
        if (2 < iVar2) {
          ldw = iVar13 * 2;
          r2w_(local_80,&ldw,l,m,pdVar1,work);
          local_84 = iVar13 + -1;
          local_54 = iVar13 * *m;
          i__3 = *m * *l;
          cfftmb_(&local_84,&c__1,m,&ldh,(fft_complex_t *)(work + 1),&local_54,
                  local_40 + (long)iVar12 + 5,&mwsav,pdVar1,&i__3,&ier1);
          iVar13 = 0x14;
          if (ier1 != 0) goto LAB_0013683b;
          w2r_(local_80,&ldw,l,m,local_70,work);
          iVar2 = *l;
        }
        pdVar1 = local_70;
        jump = local_80;
        if ((uVar4 & 1) == 0) {
          local_84 = *m;
          if (2 < (long)local_84) {
            uVar4 = local_84 + 1U & 0x7ffffffe;
            uVar7 = 3;
            if (3 < uVar4) {
              uVar7 = (ulong)uVar4;
            }
            pdVar6 = local_70 + local_90 + (long)iVar2 + local_68 * 2;
            lVar8 = uVar7 - 2;
            do {
              *pdVar6 = *pdVar6 + *pdVar6;
              pdVar6 = pdVar6 + local_68;
              lVar8 = lVar8 + -1;
            } while (lVar8 != 0);
            pdVar6 = local_70 + local_90 + local_68 * 3 + (long)iVar2;
            uVar7 = 3;
            do {
              *pdVar6 = -*pdVar6;
              uVar7 = uVar7 + 2;
              pdVar6 = pdVar6 + local_68 * 2;
            } while (uVar7 <= (ulong)(long)local_84);
          }
          local_84 = local_84 * *local_80;
          rfftmb_(&c__1,&c__1,m,local_80,local_70 + local_90 + (long)(iVar2 + (int)local_68),
                  &local_84,local_48,&mmsav,work,lenwrk,&ier1);
          iVar2 = *l;
        }
        uVar3 = (iVar2 - (iVar2 + 1 >> 0x1f)) + 1U & 0xfffffffe;
        uVar4 = *m;
        if (2 < iVar2) {
          uVar7 = 3;
          if (3 < (int)uVar3) {
            uVar7 = (ulong)uVar3;
          }
          pdVar6 = pdVar1 + local_68 + local_90 + 2;
          uVar10 = 2;
          do {
            lVar8 = (ulong)(uVar4 + 1) - 1;
            pdVar11 = pdVar6;
            if (0 < (int)uVar4) {
              do {
                *pdVar11 = *pdVar11 + *pdVar11;
                lVar8 = lVar8 + -1;
                pdVar11 = pdVar11 + local_68;
              } while (lVar8 != 0);
            }
            uVar10 = uVar10 + 1;
            pdVar6 = pdVar6 + 1;
          } while (uVar10 != uVar7);
        }
        if (0 < (int)uVar4) {
          pdVar6 = pdVar1 + local_68 + local_90;
          lVar8 = 1;
          do {
            if (2 < iVar2) {
              lVar9 = 3;
              do {
                pdVar6[lVar9] = -pdVar6[lVar9];
                lVar9 = lVar9 + 2;
              } while (lVar9 < (int)uVar3);
            }
            lVar8 = lVar8 + 1;
            pdVar6 = pdVar6 + local_68;
          } while (lVar8 != (ulong)uVar4 + 1);
        }
        local_84 = uVar4 * *jump;
        dVar14 = log((double)iVar2);
        local_54 = (int)(dVar14 / 0.6931471805599453) + iVar2 + 4;
        rfftmb_(m,jump,l,&c__1,pdVar1,&local_84,local_50,&local_54,work,lenwrk,&ier1);
        iVar13 = 0x14;
        if (ier1 == 0) {
          return 0;
        }
      }
    }
  }
LAB_0013683b:
  *ier = iVar13;
  return 0;
}

Assistant:

int rfft2b_(int *ldim, int *l, int *m, fft_real_t *r__,
	 fft_real_t *wsave, int *lensav, fft_real_t *work, int *lenwrk, int *
	ier)
{
    /* System generated locals */
    int r_dim1, r_offset, i__1, i__2, i__3;

    /* Builtin functions */


    /* Local variables */
     int i__, j;
    extern /* Subroutine */ int r2w_(int *, int *, int *, int
	    *, fft_real_t *, fft_real_t *), w2r_(int *, int *, int *, int
	    *, fft_real_t *, fft_real_t *);
     int ldh, ldw, ldx, ier1, modl, modm, mmsav, lwsav, mwsav;
    extern /* Subroutine */ int cfftmb_(), rfftmb_(int *, int *,
	    int *, int *, fft_real_t *, int *, fft_real_t *, int *, fft_real_t *
	    , int *, int *), xerfft_(char *, int *, ftnlen);



/* INITIALIZE IER */

    /* Parameter adjustments */
    r_dim1 = *ldim;
    r_offset = 1 + r_dim1;
    r__ -= r_offset;
    --wsave;
    --work;

    /* Function Body */
    *ier = 0;

/* VERIFY LENSAV */

    lwsav = *l + (int) (log((fft_real_t) (*l)) / log(2.0)) + 4;
    mwsav = (*m << 1) + (int) (log((fft_real_t) (*m)) / log(2.0)) + 4;
    mmsav = *m + (int) (log((fft_real_t) (*m)) / log(2.0)) + 4;
    modl = *l % 2;
    modm = *m % 2;

    if (*lensav < lwsav + mwsav + mmsav) {
	*ier = 2;
	//xerfft_("RFFT2F", &c__6, (ftnlen)6);
	goto L100;
    }

/* VERIFY LENWRK */

    if (*lenwrk < (*l + 1) * *m) {
	*ier = 3;
	//xerfft_("RFFT2F", &c__8, (ftnlen)6);
	goto L100;
    }

/* VERIFY LDIM IS AS BIG AS L */

    if (*ldim < *l) {
	*ier = 5;
	//xerfft_("RFFT2F", &c_n6, (ftnlen)6);
	goto L100;
    }

/* TRANSFORM SECOND DIMENSION OF ARRAY */

    i__1 = ((*m + 1) / 2 << 1) - 1;
    for (j = 2; j <= i__1; ++j) {
	r__[j * r_dim1 + 1] += r__[j * r_dim1 + 1];
    }
    i__1 = *m;
    for (j = 3; j <= i__1; j += 2) {
	r__[j * r_dim1 + 1] = -r__[j * r_dim1 + 1];
    }
    i__1 = *m * *ldim;
    rfftmb_(&c__1, &c__1, m, ldim, &r__[r_offset], &i__1, &wsave[lwsav +
	    mwsav + 1], &mmsav, &work[1], lenwrk, &ier1);
    ldh = (*l + 1) / 2;
    if (ldh > 1) {
	ldw = ldh + ldh;

/*     R AND WORK ARE SWITCHED BECAUSE THE THE FIRST DIMENSION */
/*     OF THE INPUT TO COMPLEX CFFTMF MUST BE EVEN. */

	r2w_(ldim, &ldw, l, m, &r__[r_offset], &work[1]);
	i__1 = ldh - 1;
	i__2 = ldh * *m;
	i__3 = *l * *m;
	cfftmb_(&i__1, &c__1, m, &ldh, (complex*)&work[2], &i__2, &wsave[lwsav + 1], &
		mwsav, &r__[r_offset], &i__3, &ier1);
	if (ier1 != 0) {
	    *ier = 20;
	    //xerfft_("RFFT2B", &c_n5, (ftnlen)6);
	    goto L100;
	}
	w2r_(ldim, &ldw, l, m, &r__[r_offset], &work[1]);
    }

    if (modl == 0) {
	i__1 = ((*m + 1) / 2 << 1) - 1;
	for (j = 2; j <= i__1; ++j) {
	    r__[*l + j * r_dim1] += r__[*l + j * r_dim1];
	}
	i__1 = *m;
	for (j = 3; j <= i__1; j += 2) {
	    r__[*l + j * r_dim1] = -r__[*l + j * r_dim1];
	}
	i__1 = *m * *ldim;
	rfftmb_(&c__1, &c__1, m, ldim, &r__[*l + r_dim1], &i__1, &wsave[lwsav
		+ mwsav + 1], &mmsav, &work[1], lenwrk, &ier1);
    }

/*     PRINT*, 'BACKWARD TRANSFORM IN THE J DIRECTION' */
/*     DO I=1,L */
/*       PRINT*, (R(I,J),J=1,M) */
/*     END DO */

/* TRANSFORM FIRST DIMENSION OF ARRAY */

    ldx = ((*l + 1) / 2 << 1) - 1;
    i__1 = ldx;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *m;
	for (j = 1; j <= i__2; ++j) {
	    r__[i__ + j * r_dim1] += r__[i__ + j * r_dim1];
	}
    }
    i__1 = *m;
    for (j = 1; j <= i__1; ++j) {
	i__2 = ldx;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    r__[i__ + j * r_dim1] = -r__[i__ + j * r_dim1];
	}
    }
    i__1 = *m * *ldim;
    i__2 = *l + (int) (log((fft_real_t) (*l)) / log(2.0)) + 4;
    rfftmb_(m, ldim, l, &c__1, &r__[r_offset], &i__1, &wsave[1], &i__2, &work[
	    1], lenwrk, &ier1);


/*     PRINT*, 'BACKWARD TRANSFORM IN THE I DIRECTION' */
/*     DO I=1,L */
/*       PRINT*, (R(I,J),J=1,M) */
/*     END DO */

    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("RFFT2F", &c_n5, (ftnlen)6);
	goto L100;
    }

    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("RFFT2F", &c_n5, (ftnlen)6);
	goto L100;
    }

L100:

    return 0;
}